

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::FastInstancesIterator::
~FastInstancesIterator(FastInstancesIterator *this)

{
  InstMatcher *in_RDI;
  
  Lib::
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::NodeAlgorithm>::
  ~Stack((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::NodeAlgorithm>
          *)in_RDI);
  Lib::Stack<unsigned_int>::~Stack((Stack<unsigned_int> *)in_RDI);
  Lib::Stack<void_*>::~Stack((Stack<void_*> *)in_RDI);
  Kernel::Renaming::~Renaming((Renaming *)0x48f7e2);
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::InstMatcher::~InstMatcher(in_RDI)
  ;
  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>::~VirtualIterator
            ((VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *)in_RDI);
  return;
}

Assistant:

FastInstancesIterator(FastInstancesIterator&&) = default;